

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inline_pass.cpp
# Opt level: O3

void __thiscall spvtools::opt::InlinePass::AnalyzeReturns(InlinePass *this,Function *func)

{
  _Head_base<0UL,_spvtools::opt::Instruction_*,_false> _Var1;
  pointer puVar2;
  BasicBlock *pBVar3;
  bool bVar4;
  Function *__range2;
  pointer puVar5;
  uint32_t local_30;
  uint32_t local_2c;
  
  bVar4 = HasNoReturnInLoop(this,func);
  if (bVar4) {
    _Var1._M_head_impl =
         (func->def_inst_)._M_t.
         super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
         ._M_t.
         super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
         .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
    local_2c = 0;
    if ((_Var1._M_head_impl)->has_result_id_ == true) {
      local_2c = Instruction::GetSingleWordOperand
                           (_Var1._M_head_impl,(uint)(_Var1._M_head_impl)->has_type_id_);
    }
    std::
    _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
    ::_M_insert_unique<unsigned_int>(&(this->no_return_in_loop_)._M_t,&local_2c);
  }
  puVar5 = (func->blocks_).
           super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar2 = (func->blocks_).
           super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  while( true ) {
    if (puVar5 == puVar2) {
      return;
    }
    pBVar3 = (puVar5->_M_t).
             super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
             ._M_t.
             super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
             .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl;
    bVar4 = spvOpcodeIsReturn((*(Instruction **)
                                ((long)&(pBVar3->insts_).
                                        super_IntrusiveList<spvtools::opt::Instruction> + 0x18))->
                              opcode_);
    if ((bVar4) &&
       (pBVar3 != (func->blocks_).
                  super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
                  super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
                  .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl)) break;
    puVar5 = puVar5 + 1;
  }
  _Var1._M_head_impl =
       (func->def_inst_)._M_t.
       super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
       ._M_t.
       super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
       .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
  local_30 = 0;
  if ((_Var1._M_head_impl)->has_result_id_ == true) {
    local_30 = Instruction::GetSingleWordOperand
                         (_Var1._M_head_impl,(uint)(_Var1._M_head_impl)->has_type_id_);
  }
  std::
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  ::_M_insert_unique<unsigned_int>(&(this->early_return_funcs_)._M_t,&local_30);
  return;
}

Assistant:

void InlinePass::AnalyzeReturns(Function* func) {
  // Analyze functions without a return in loop.
  if (HasNoReturnInLoop(func)) {
    no_return_in_loop_.insert(func->result_id());
  }
  // Analyze functions with a return before its tail basic block.
  for (auto& blk : *func) {
    auto terminal_ii = blk.cend();
    --terminal_ii;
    if (spvOpcodeIsReturn(terminal_ii->opcode()) && &blk != func->tail()) {
      early_return_funcs_.insert(func->result_id());
      break;
    }
  }
}